

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  cmMakefile *this_00;
  cmValue cVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view arg;
  string includePathVar;
  string local_98;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  local_40 = (lang->_M_dataplus)._M_p;
  local_48 = lang->_M_string_length;
  local_58._M_len = 6;
  local_58._M_str = "CMAKE_";
  local_38 = 0x14;
  local_30 = "_TARGET_INCLUDE_PATH";
  views._M_len = 3;
  views._M_array = &local_58;
  cmCatViews_abi_cxx11_(&local_98,views);
  this_00 = (this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  cVar1 = cmMakefile::GetDefinition(this_00,&local_98);
  if (cVar1.Value == (string *)0x0) {
    local_40 = (lang->_M_dataplus)._M_p;
    local_48 = lang->_M_string_length;
    local_58._M_len = 6;
    local_58._M_str = "CMAKE_";
    local_38 = 0xd;
    local_30 = "_INCLUDE_PATH";
    views_00._M_len = 3;
    views_00._M_array = &local_58;
    cmCatViews_abi_cxx11_(&local_78,views_00);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    cVar1 = cmMakefile::GetDefinition(this_00,&local_98);
    if (cVar1.Value == (string *)0x0) goto LAB_0049b842;
  }
  arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar1.Value)->_M_string_length;
  cmExpandList(arg,&this->IncludePath,false);
LAB_0049b842:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  std::string includePathVar =
    cmStrCat("CMAKE_", lang, "_TARGET_INCLUDE_PATH");
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmValue includePath = mf->GetDefinition(includePathVar);
  if (includePath) {
    cmExpandList(*includePath, this->IncludePath);
  } else {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = cmStrCat("CMAKE_", lang, "_INCLUDE_PATH");
    includePath = mf->GetDefinition(includePathVar);
    if (includePath) {
      cmExpandList(*includePath, this->IncludePath);
    }
  }
}